

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::DateFormat::format
          (DateFormat *this,UDate date,UnicodeString *appendTo,FieldPositionIterator *posIter,
          UErrorCode *status)

{
  int iVar1;
  undefined4 extraout_var;
  Calendar *this_00;
  
  if (this->fCalendar != (Calendar *)0x0) {
    iVar1 = (*(this->fCalendar->super_UObject)._vptr_UObject[3])();
    this_00 = (Calendar *)CONCAT44(extraout_var,iVar1);
    if (this_00 != (Calendar *)0x0) {
      Calendar::setTimeInMillis(this_00,date,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        (*(this->super_Format).super_UObject._vptr_UObject[9])(this,this_00,appendTo,posIter,status)
        ;
      }
      (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
    }
  }
  return appendTo;
}

Assistant:

UnicodeString&
DateFormat::format(UDate date, UnicodeString& appendTo, FieldPositionIterator* posIter,
                   UErrorCode& status) const {
    if (fCalendar != NULL) {
        Calendar* calClone = fCalendar->clone();
        if (calClone != NULL) {
            calClone->setTime(date, status);
            if (U_SUCCESS(status)) {
               format(*calClone, appendTo, posIter, status);
            }
            delete calClone;
        }
    }
    return appendTo;
}